

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::InstructionFolder::FoldIntegerOpToConstant
          (InstructionFolder *this,Instruction *inst,function<unsigned_int_(unsigned_int)> *id_map,
          uint32_t *result)

{
  bool bVar1;
  Op opcode;
  uint32_t uVar2;
  bool local_41;
  uint32_t *result_local;
  function<unsigned_int_(unsigned_int)> *id_map_local;
  Instruction *inst_local;
  InstructionFolder *this_local;
  
  opcode = opt::Instruction::opcode(inst);
  bVar1 = IsFoldableOpcode(this,opcode);
  if (!bVar1) {
    __assert_fail("IsFoldableOpcode(inst->opcode()) && \"Unhandled instruction opcode in FoldScalars\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp"
                  ,0x1d2,
                  "bool spvtools::opt::InstructionFolder::FoldIntegerOpToConstant(Instruction *, const std::function<uint32_t (uint32_t)> &, uint32_t *) const"
                 );
  }
  uVar2 = opt::Instruction::NumInOperands(inst);
  if (uVar2 == 2) {
    bVar1 = FoldBinaryIntegerOpToConstant(this,inst,id_map,result);
    local_41 = true;
    if (!bVar1) {
      local_41 = FoldBinaryBooleanOpToConstant(this,inst,id_map,result);
    }
    this_local._7_1_ = local_41;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool InstructionFolder::FoldIntegerOpToConstant(
    Instruction* inst, const std::function<uint32_t(uint32_t)>& id_map,
    uint32_t* result) const {
  assert(IsFoldableOpcode(inst->opcode()) &&
         "Unhandled instruction opcode in FoldScalars");
  switch (inst->NumInOperands()) {
    case 2:
      return FoldBinaryIntegerOpToConstant(inst, id_map, result) ||
             FoldBinaryBooleanOpToConstant(inst, id_map, result);
    default:
      return false;
  }
}